

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.cc
# Opt level: O3

string * __thiscall
upb::generator::FileWarning_abi_cxx11_
          (string *__return_storage_ptr__,generator *this,string_view filename)

{
  size_t in_R9;
  string_view format;
  generator *local_28;
  size_t local_20;
  
  local_20 = filename._M_len;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  format._M_str = (char *)&local_28;
  format._M_len =
       (size_t)
       "/* This file was generated by upb_generator from the input file:\n *\n *     $0\n *\n * Do not edit -- your changes will be discarded when the file is\n * regenerated.\n * NO CHECKED-IN PROTOBUF GENCODE */\n\n"
  ;
  local_28 = this;
  absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
            ((substitute_internal *)__return_storage_ptr__,(Nonnull<std::string_*>)0xc9,format,
             (Nullable<const_absl::string_view_*>)0x1,in_R9);
  return __return_storage_ptr__;
}

Assistant:

std::string FileWarning(absl::string_view filename) {
  return absl::Substitute(
      "/* This file was generated by upb_generator from the input file:\n"
      " *\n"
      " *     $0\n"
      " *\n"
      " * Do not edit -- your changes will be discarded when the file is\n"
      " * regenerated.\n"
      " * NO CHECKED-IN "
      // Intentional line break.
      "PROTOBUF GENCODE */\n"
      "\n",
      filename);
}